

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManCollectPoIds(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int *piVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = p->vCos->nSize - p->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar3 = iVar5;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar3;
  if (iVar3 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar3 << 2);
  }
  p_00->pArray = piVar1;
  pVVar2 = p->vCos;
  uVar4 = (ulong)(uint)pVVar2->nSize;
  if (p->nRegs < pVVar2->nSize) {
    lVar6 = 0;
    do {
      if ((int)uVar4 <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,pVVar2->pArray[lVar6]);
      lVar6 = lVar6 + 1;
      pVVar2 = p->vCos;
      uVar4 = (ulong)pVVar2->nSize;
    } while (lVar6 < (long)(uVar4 - (long)p->nRegs));
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectPoIds( Gia_Man_t * p )
{
    Vec_Int_t * vStart;
    int Entry, i;
    vStart = Vec_IntAlloc( Gia_ManPoNum(p) );
    Vec_IntForEachEntryStop( p->vCos, Entry, i, Gia_ManPoNum(p) )
        Vec_IntPush( vStart, Entry );
    return vStart;
}